

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O3

Json __thiscall json11::Json::parse(Json *this,string *in,string *err,JsonParse strategy)

{
  char *__s;
  size_t sVar1;
  size_t sVar2;
  long *plVar3;
  uint uVar4;
  long *plVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  Json JVar7;
  Json result;
  char buf [12];
  JsonParser parser;
  JsonParser local_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long *local_58 [2];
  long local_48 [2];
  undefined1 local_38 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  local_38._8_8_ = 0;
  local_38[0x18] = false;
  local_38._0_8_ = in;
  local_38._16_8_ = err;
  local_38._28_4_ = strategy;
  anon_unknown_22::JsonParser::parse_json(&local_98,(int)(JsonParser *)local_38);
  anon_unknown_22::JsonParser::consume_garbage((JsonParser *)local_38);
  sVar1 = local_98.i;
  if ((bool)local_38[0x18] == true) {
    Json(this);
    _Var6._M_pi = extraout_RDX_00;
  }
  else if (local_38._8_8_ == in->_M_string_length) {
    local_98.i = 0;
    (this->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98.str;
    (this->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar1;
    local_98.str = (string *)0x0;
    _Var6._M_pi = extraout_RDX;
  }
  else {
    uVar4 = (uint)(in->_M_dataplus)._M_p[local_38._8_8_];
    if ((int)uVar4 < 0x20) {
      snprintf((char *)((long)&local_98.err + 4),0xc,"(%d)");
    }
    else {
      snprintf((char *)((long)&local_98.err + 4),0xc,"\'%c\' (%d)",(ulong)uVar4,(ulong)uVar4);
    }
    __s = (char *)((long)&local_98.err + 4);
    local_58[0] = local_48;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,__s,(long)&local_98.err + sVar2 + 4);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x15b509);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_68 = *plVar5;
      lStack_60 = plVar3[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar5;
      local_78 = (long *)*plVar3;
    }
    local_70 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    JVar7 = anon_unknown_22::JsonParser::fail((JsonParser *)this,(string *)local_38);
    _Var6._M_pi = JVar7.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
      _Var6._M_pi = extraout_RDX_01;
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
      _Var6._M_pi = extraout_RDX_02;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.i !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.i);
    _Var6._M_pi = extraout_RDX_03;
  }
  JVar7.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  JVar7.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Json)JVar7.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Json Json::parse(const string &in, string &err, JsonParse strategy) {
    JsonParser parser { in, 0, err, false, strategy };
    Json result = parser.parse_json(0);

    // Check for any trailing garbage
    parser.consume_garbage();
    if (parser.failed)
        return Json();
    if (parser.i != in.size())
        return parser.fail("unexpected trailing " + esc(in[parser.i]));

    return result;
}